

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture3DGradOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float r;
  Texture3D *pTVar1;
  int i_1;
  int i;
  long lVar2;
  float lod;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_58 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38 [6];
  int local_20;
  
  s = c->in[0].m_data[0];
  pTVar1 = c->textures[0].tex3D;
  t = c->in[0].m_data[1];
  r = c->in[0].m_data[2];
  lVar2 = 0;
  lod = glu::TextureTestUtil::computeLodFromDerivates
                  (LODMODE_EXACT,c->in[1].m_data[0] * (float)pTVar1->m_width,
                   c->in[1].m_data[1] * (float)pTVar1->m_height,
                   c->in[1].m_data[2] * (float)pTVar1->m_depth,
                   (float)pTVar1->m_width * c->in[2].m_data[0],
                   (float)pTVar1->m_height * c->in[2].m_data[1],
                   (float)pTVar1->m_depth * c->in[2].m_data[2]);
  local_38[4] = (p->offset).m_data[0];
  local_38[5] = (p->offset).m_data[1];
  local_20 = (p->offset).m_data[2];
  pTVar1 = c->textures[0].tex3D;
  tcu::sampleLevelArray3DOffset
            ((ConstPixelBufferAccess *)local_38,(int)(pTVar1->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar1->m_view).m_numLevels,s,t,r,lod,(IVec3 *)c->textures);
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  do {
    local_58[lVar2] = local_38[lVar2] * (p->scale).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + (p->bias).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(c->color).m_data = local_48;
  *(undefined8 *)((c->color).m_data + 2) = uStack_40;
  return;
}

Assistant:

static void		evalTexture3DGradOffset			(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3DOffset(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad3D(c), p.offset)*p.scale + p.bias; }